

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionObservationIndependentMADPDiscrete.h
# Opt level: O1

Index __thiscall
TransitionObservationIndependentMADPDiscrete::SampleSuccessorState
          (TransitionObservationIndependentMADPDiscrete *this,Index sI,Index jaI)

{
  Index IVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> aIs;
  vector<unsigned_int,_std::allocator<unsigned_int>_> sIs;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_40;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_28;
  
  pvVar2 = JointToIndividualStateIndices(this,sI);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_28,pvVar2);
  pvVar2 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
           (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x60))(this,jaI);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_40,pvVar2);
  SampleSuccessorState(&local_58,this,&local_28,&local_40);
  IVar1 = IndexTools::IndividualToJointIndicesStepSize(&local_58,&this->_m_stateStepSize);
  if (local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return IVar1;
}

Assistant:

Index SampleSuccessorState(Index sI, Index jaI) const
        {
            std::vector<Index> sIs=JointToIndividualStateIndices(sI);
            std::vector<Index> aIs=JointToIndividualActionIndices(jaI);
            return(IndividualToJointStateIndices(SampleSuccessorState(sIs,aIs)));
        }